

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

void ma_fence_uninit(ma_fence *pFence)

{
  void *in_RDI;
  
  if ((in_RDI != (void *)0x0) && (in_RDI != (void *)0x0)) {
    memset(in_RDI,0,4);
  }
  return;
}

Assistant:

MA_API void ma_fence_uninit(ma_fence* pFence)
{
    if (pFence == NULL) {
        return;
    }

    #ifndef MA_NO_THREADING
    {
        ma_event_uninit(&pFence->e);
    }
    #endif

    MA_ZERO_OBJECT(pFence);
}